

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

bool __thiscall Clasp::Solver::Dirty::add(Dirty *this,Literal p,WatchList *wl,ClauseHead *c)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  uintp other;
  left_type local_14;
  
  uVar1 = (wl->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.left_;
  if (0x27 < uVar1) {
    uVar3 = *(uint *)&(wl->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>
                      .field_0x8 & 0x7fffffff;
    if (uVar3 - (wl->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.
                right_ < 0x10) {
      other = 0;
    }
    else {
      other = *(uintp *)((wl->super_type).
                         super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_ +
                        ((ulong)uVar3 - 0x10));
    }
    bVar2 = add<Clasp::ClauseHead>
                      (this,(ClauseHead **)
                            (wl->super_type).
                            super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_,other
                       ,&c->super_Constraint);
    if (bVar2) {
      bk_lib::detail::left_right_rep<Clasp::Literal,_unsigned_int>::push_left
                ((left_right_rep<Clasp::Literal,_unsigned_int> *)this,&local_14);
    }
  }
  return 0x27 < uVar1;
}

Assistant:

bool add(Literal p, WatchList& wl, ClauseHead* c) {
		if (wl.left_size() <= min_size) { return false; }
		uintp o = wl.right_size() > 0 ? reinterpret_cast<uintp>(wl.right_begin()->con) : 0;
		if (add(wl.left_begin()->head, o, c)) { dirty.push_left(p); }
		return true;
	}